

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::internal::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  bigint *lhs2;
  char *pcVar3;
  int iVar4;
  int *in_RSI;
  bigint *in_RDI;
  int result;
  bool high;
  bool low;
  int digit;
  char *data;
  int num_digits;
  bool even;
  uint64_t significand;
  int shift;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  bigint *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  int in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 uVar5;
  int in_stack_fffffffffffffcf4;
  undefined2 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfa;
  byte in_stack_fffffffffffffcfb;
  int in_stack_fffffffffffffcfc;
  fp *in_stack_fffffffffffffd00;
  int iVar6;
  undefined4 in_stack_fffffffffffffd0c;
  uint uVar7;
  undefined4 in_stack_fffffffffffffd18;
  fp local_2e0;
  undefined1 *local_2d0;
  undefined1 local_2c8 [168];
  undefined1 local_220 [520];
  int *local_18;
  bigint *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  local_2d0 = (undefined1 *)0x0;
  fp::fp(&local_2e0);
  bVar1 = fp::assign<double,_0>
                    (in_stack_fffffffffffffd00,
                     (double)CONCAT44(in_stack_fffffffffffffcfc,
                                      CONCAT13(in_stack_fffffffffffffcfb,
                                               CONCAT12(in_stack_fffffffffffffcfa,
                                                        in_stack_fffffffffffffcf8))));
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcf0);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = 2;
  }
  lhs2 = (bigint *)(local_2e0.f << (sbyte)iVar2);
  if (local_2e0.e < 0) {
    if (*local_18 < 0) {
      bigint::assign_pow10(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar5),
                     (bigint *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      if (iVar2 != 1) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar5),
                       (bigint *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        bigint::operator<<=((bigint *)
                            CONCAT44(in_stack_fffffffffffffcfc,
                                     CONCAT13(in_stack_fffffffffffffcfb,
                                              CONCAT12(in_stack_fffffffffffffcfa,
                                                       in_stack_fffffffffffffcf8))),
                            in_stack_fffffffffffffcf4);
        local_2d0 = local_2c8;
      }
      bigint::operator*=(in_stack_fffffffffffffcd0,
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcfc,
                                   CONCAT13(in_stack_fffffffffffffcfb,
                                            CONCAT12(in_stack_fffffffffffffcfa,
                                                     in_stack_fffffffffffffcf8))),
                          in_stack_fffffffffffffcf4);
    }
    else {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      bigint::assign_pow10(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcfc,
                                   CONCAT13(in_stack_fffffffffffffcfb,
                                            CONCAT12(in_stack_fffffffffffffcfa,
                                                     in_stack_fffffffffffffcf8))),
                          in_stack_fffffffffffffcf4);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if (iVar2 != 1) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_2d0 = local_2c8;
      }
    }
  }
  else {
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcfc,
                                 CONCAT13(in_stack_fffffffffffffcfb,
                                          CONCAT12(in_stack_fffffffffffffcfa,
                                                   in_stack_fffffffffffffcf8))),
                        in_stack_fffffffffffffcf4);
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcfc,
                                 CONCAT13(in_stack_fffffffffffffcfb,
                                          CONCAT12(in_stack_fffffffffffffcfa,
                                                   in_stack_fffffffffffffcf8))),
                        in_stack_fffffffffffffcf4);
    if (iVar2 != 1) {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcfc,
                                   CONCAT13(in_stack_fffffffffffffcfb,
                                            CONCAT12(in_stack_fffffffffffffcfa,
                                                     in_stack_fffffffffffffcf8))),
                          in_stack_fffffffffffffcf4);
      local_2d0 = local_2c8;
    }
    bigint::assign_pow10(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcfc,
                                 CONCAT13(in_stack_fffffffffffffcfb,
                                          CONCAT12(in_stack_fffffffffffffcfa,
                                                   in_stack_fffffffffffffcf8))),
                        in_stack_fffffffffffffcf4);
  }
  if (local_2d0 == (undefined1 *)0x0) {
    local_2d0 = local_220;
  }
  uVar7 = CONCAT13((local_2e0.f & 1) == 0,(int3)in_stack_fffffffffffffd0c);
  iVar6 = 0;
  pcVar3 = buffer<char>::data((buffer<char> *)local_10);
  while( true ) {
    in_stack_fffffffffffffcfc =
         bigint::divmod_assign
                   ((bigint *)
                    CONCAT44(in_stack_fffffffffffffcfc,
                             CONCAT13(in_stack_fffffffffffffcfb,
                                      CONCAT12(in_stack_fffffffffffffcfa,in_stack_fffffffffffffcf8))
                            ),(bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar5));
    in_stack_fffffffffffffce8 =
         compare((bigint *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffce8),
                 (bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    in_stack_fffffffffffffcfb = (byte)(in_stack_fffffffffffffce8 - (uVar7 >> 0x18 & 1) >> 0x1f);
    in_stack_fffffffffffffce4 =
         add_compare((bigint *)CONCAT44(iVar2,in_stack_fffffffffffffd18),lhs2,
                     (bigint *)CONCAT44(uVar7,iVar6));
    in_stack_fffffffffffffcfa =
         0 < (int)(in_stack_fffffffffffffce4 + (uint)((byte)(uVar7 >> 0x18) & 1));
    iVar4 = iVar6 + 1;
    pcVar3[iVar6] = (char)in_stack_fffffffffffffcfc + '0';
    if (((in_stack_fffffffffffffcfb & 1) != 0) || ((bool)in_stack_fffffffffffffcfa)) break;
    bigint::operator*=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    bigint::operator*=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    iVar6 = iVar4;
    if (local_2d0 != local_220) {
      bigint::operator*=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      iVar6 = iVar4;
    }
  }
  if ((in_stack_fffffffffffffcfb & 1) == 0) {
    pcVar3[iVar6] = pcVar3[iVar6] + '\x01';
  }
  else if (((bool)in_stack_fffffffffffffcfa) &&
          ((iVar2 = add_compare((bigint *)CONCAT44(iVar2,in_stack_fffffffffffffd18),lhs2,
                                (bigint *)CONCAT44(uVar7,iVar4)), 0 < iVar2 ||
           ((iVar2 == 0 && (in_stack_fffffffffffffcfc % 2 != 0)))))) {
    pcVar3[iVar4 + -1] = pcVar3[iVar4 + -1] + '\x01';
  }
  to_unsigned<int>(0);
  buffer<char>::resize
            ((buffer<char> *)local_10,CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
  ;
  *local_18 = *local_18 - (iVar4 + -1);
  bigint::~bigint(local_10);
  bigint::~bigint(local_10);
  bigint::~bigint(local_10);
  bigint::~bigint(local_10);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}